

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_set_socket_options_ip(lws_sockfd_type fd,uint8_t pri,int lws_flags)

{
  int iVar1;
  uint *puVar2;
  int en;
  socklen_t optlen;
  int n;
  int ret;
  int optval;
  int lws_flags_local;
  uint8_t pri_local;
  lws_sockfd_type fd_local;
  
  n = (int)pri;
  optlen = 0;
  ret = lws_flags;
  optval._3_1_ = pri;
  lws_flags_local = fd;
  if (pri != '\0') {
    iVar1 = setsockopt(fd,1,0xc,&n,4);
    if (-1 < iVar1) {
      _lws_log(4,"%s: set pri %u\n","lws_plat_set_socket_options_ip",(ulong)optval._3_1_);
    }
    else {
      puVar2 = (uint *)__errno_location();
      _lws_log(2,"%s: unable to set socket pri %d: errno %d\n","lws_plat_set_socket_options_ip",
               (ulong)optval._3_1_,(ulong)*puVar2);
    }
    optlen = (socklen_t)(-1 >= iVar1);
  }
  for (en = 0; en < 4; en = en + 1) {
    if ((ret & ip_opt_lws_flags[en]) != 0) {
      n = ip_opt_val[en];
      iVar1 = setsockopt(lws_flags_local,0,1,&n,4);
      if (iVar1 < 0) {
        puVar2 = (uint *)__errno_location();
        _lws_log(2,"%s: unable to set %s: errno %d\n","lws_plat_set_socket_options_ip",
                 ip_opt_names[en],(ulong)*puVar2);
        optlen = 1;
      }
      else {
        _lws_log(4,"%s: set ip flag %s\n","lws_plat_set_socket_options_ip",ip_opt_names[en]);
      }
    }
  }
  return optlen;
}

Assistant:

int
lws_plat_set_socket_options_ip(lws_sockfd_type fd, uint8_t pri, int lws_flags)
{
	int optval = (int)pri, ret = 0, n;
	socklen_t optlen = sizeof(optval);
#if !defined(LWS_WITH_NO_LOGS)
	int en;
#endif

#if 0
#if defined(TCP_FASTOPEN_CONNECT)
	optval = 1;
	if (setsockopt(fd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT, (void *)&optval,
		       sizeof(optval)))
		lwsl_warn("%s: FASTOPEN_CONNECT failed\n", __func__);
	optval = (int)pri;
#endif
#endif

#if !defined(__APPLE__) && \
      !defined(__FreeBSD__) && !defined(__FreeBSD_kernel__) &&        \
      !defined(__NetBSD__) && \
      !defined(__OpenBSD__) && \
      !defined(__sun) && \
      !defined(__HAIKU__) && \
      !defined(__CYGWIN__)

	/* the BSDs don't have SO_PRIORITY */

	if (pri) { /* 0 is the default already */
		if (setsockopt(fd, SOL_SOCKET, SO_PRIORITY,
				(const void *)&optval, optlen) < 0) {
#if !defined(LWS_WITH_NO_LOGS)
			en = errno;
			lwsl_warn("%s: unable to set socket pri %d: errno %d\n",
				  __func__, (int)pri, en);
#endif
			ret = 1;
		} else
			lwsl_notice("%s: set pri %u\n", __func__, pri);
	}
#endif

	for (n = 0; n < 4; n++) {
		if (!(lws_flags & ip_opt_lws_flags[n]))
			continue;

		optval = (int)ip_opt_val[n];
		if (setsockopt(fd, IPPROTO_IP, IP_TOS, (const void *)&optval,
			       optlen) < 0) {
#if !defined(LWS_WITH_NO_LOGS)
			en = errno;
			lwsl_warn("%s: unable to set %s: errno %d\n", __func__,
				  ip_opt_names[n], en);
#endif
			ret = 1;
		} else
			lwsl_notice("%s: set ip flag %s\n", __func__,
				    ip_opt_names[n]);
	}

	return ret;
}